

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_pic.cpp
# Opt level: O0

void __thiscall QPicturePaintEngine::drawPath(QPicturePaintEngine *this,QPainterPath *path)

{
  long lVar1;
  QPicturePaintEnginePrivate *p;
  QDataStream *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  int pos;
  QPicturePaintEnginePrivate *d;
  quint8 in_stack_ffffffffffffff9f;
  undefined1 in_stack_ffffffffffffffdf;
  QRectF *in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffec;
  QPicturePaintEngine *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  p = d_func((QPicturePaintEngine *)0x310c3f);
  p->pic_d->trecs = p->pic_d->trecs + 1;
  QDataStream::operator<<(in_RDI,in_stack_ffffffffffffff9f);
  QDataStream::operator<<(in_RDI,in_stack_ffffffffffffff9f);
  QBuffer::pos();
  ::operator<<(in_RSI,(QPainterPath *)p);
  QPainterPath::boundingRect((QPainterPath *)&stack0xffffffffffffffd8);
  writeCmdLength(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe0,
                 (bool)in_stack_ffffffffffffffdf);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPicturePaintEngine::drawPath(const QPainterPath &path)
{
    Q_D(QPicturePaintEngine);
#ifdef QT_PICTURE_DEBUG
    qDebug() << " -> drawPath():" << path.boundingRect();
#endif
    int pos;
    SERIALIZE_CMD(QPicturePrivate::PdcDrawPath);
    d->s << path;
    writeCmdLength(pos, path.boundingRect(), true);
}